

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi_custom_type.cpp
# Opt level: O0

void CAPIRegisterCustomType
               (duckdb_connection connection,char *name,duckdb_type duckdb_type,
               duckdb_state expected_outcome)

{
  undefined4 in_EDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  AssertionHandler catchAssertionHandler;
  duckdb_logical_type base_type;
  duckdb_state status;
  undefined4 in_stack_fffffffffffffef8;
  Flags in_stack_fffffffffffffefc;
  char *in_stack_ffffffffffffff00;
  AssertionHandler *this;
  StringRef *in_stack_ffffffffffffff08;
  AssertionHandler *in_stack_ffffffffffffff10;
  StringRef in_stack_ffffffffffffff18;
  duckdb_state *in_stack_ffffffffffffff30;
  ExprLhs<const_duckdb_state_&> *in_stack_ffffffffffffff38;
  AssertionHandler local_90;
  undefined8 local_28;
  undefined4 local_1c;
  undefined8 local_10;
  undefined8 local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_28 = duckdb_create_logical_type(in_EDX);
  duckdb_logical_type_set_alias(local_28,local_10);
  local_1c = duckdb_register_logical_type(local_8,local_28,0);
  local_90.m_assertionInfo.lineInfo =
       (SourceLineInfo)
       operator____catch_sr
                 (in_stack_ffffffffffffff00,
                  CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  this = &local_90;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)this,
             "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/test/api/capi/capi_custom_type.cpp"
             ,0xf);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08);
  Catch::AssertionHandler::AssertionHandler
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,(SourceLineInfo *)this,
             in_stack_ffffffffffffff18,in_stack_fffffffffffffefc);
  Catch::Decomposer::operator<=
            ((Decomposer *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
             (duckdb_state *)0x45dfc7);
  Catch::ExprLhs<duckdb_state_const&>::operator==
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  Catch::AssertionHandler::handleExpr
            (this,(ITransientExpression *)
                  CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  Catch::BinaryExpr<const_duckdb_state_&,_const_duckdb_state_&>::~BinaryExpr
            ((BinaryExpr<const_duckdb_state_&,_const_duckdb_state_&> *)0x45e00f);
  Catch::AssertionHandler::complete(this);
  Catch::AssertionHandler::~AssertionHandler(this);
  duckdb_destroy_logical_type(&local_28);
  duckdb_destroy_logical_type(&local_28);
  duckdb_destroy_logical_type(0);
  return;
}

Assistant:

static void CAPIRegisterCustomType(duckdb_connection connection, const char *name, duckdb_type duckdb_type,
                                   duckdb_state expected_outcome) {
	duckdb_state status;

	auto base_type = duckdb_create_logical_type(duckdb_type);
	duckdb_logical_type_set_alias(base_type, name);

	status = duckdb_register_logical_type(connection, base_type, nullptr);
	REQUIRE(status == expected_outcome);

	duckdb_destroy_logical_type(&base_type);
	duckdb_destroy_logical_type(&base_type);
	duckdb_destroy_logical_type(nullptr);
}